

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O0

void multipredict(nn *n,single_learner *base,example *ec,size_t count,size_t step,
                 polyprediction *pred,bool finalize_predictions)

{
  undefined8 *puVar1;
  ulong in_RCX;
  long in_RDX;
  long in_R8;
  long in_R9;
  size_t c;
  example *in_stack_000003e0;
  single_learner *in_stack_000003e8;
  nn *in_stack_000003f0;
  example *in_stack_00000400;
  single_learner *in_stack_00000408;
  nn *in_stack_00000410;
  ulong local_40;
  
  for (local_40 = 0; local_40 < in_RCX; local_40 = local_40 + 1) {
    if (local_40 == 0) {
      predict_or_learn_multi<false,true>(in_stack_00000410,in_stack_00000408,in_stack_00000400);
    }
    else {
      predict_or_learn_multi<false,false>(in_stack_000003f0,in_stack_000003e8,in_stack_000003e0);
    }
    if (((byte)c & 1) == 0) {
      *(undefined4 *)(in_R9 + local_40 * 0x20) = *(undefined4 *)(in_RDX + 0x68a8);
    }
    else {
      puVar1 = (undefined8 *)(in_R9 + local_40 * 0x20);
      *puVar1 = *(undefined8 *)(in_RDX + 0x6850);
      puVar1[1] = *(undefined8 *)(in_RDX + 0x6858);
      puVar1[2] = *(undefined8 *)(in_RDX + 0x6860);
      puVar1[3] = *(undefined8 *)(in_RDX + 0x6868);
    }
    *(long *)(in_RDX + 0x6820) = in_R8 + *(long *)(in_RDX + 0x6820);
  }
  *(ulong *)(in_RDX + 0x6820) = *(long *)(in_RDX + 0x6820) - in_R8 * in_RCX;
  return;
}

Assistant:

void multipredict(nn& n, single_learner& base, example& ec, size_t count, size_t step, polyprediction* pred,
    bool finalize_predictions)
{
  for (size_t c = 0; c < count; c++)
  {
    if (c == 0)
      predict_or_learn_multi<false, true>(n, base, ec);
    else
      predict_or_learn_multi<false, false>(n, base, ec);
    if (finalize_predictions)
      pred[c] = ec.pred;
    else
      pred[c].scalar = ec.partial_prediction;
    ec.ft_offset += (uint64_t)step;
  }
  ec.ft_offset -= (uint64_t)(step * count);
}